

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void add_parameter_to_current_function(ParserState *parser,LuaSymbolList **list,LuaSymbol *symbol)

{
  LuaSymbol *symbol_local;
  LuaSymbolList **list_local;
  ParserState *parser_local;
  
  *(byte *)((long)&symbol->field_1 + 0x28) = *(byte *)((long)&symbol->field_1 + 0x28) & 0xfd | 2;
  raviX_add_symbol(parser->compiler_state,list,symbol);
  add_local_symbol_to_current_scope(parser,symbol);
  return;
}

Assistant:

static void add_parameter_to_current_function(ParserState *parser, LuaSymbolList **list, LuaSymbol *symbol)
{
	symbol->variable.function_parameter = 1;
	raviX_add_symbol(parser->compiler_state, list, symbol);
	add_local_symbol_to_current_scope(parser, symbol);
}